

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

int LoadEXRFromMemory(float **out_rgba,int *width,int *height,uchar *memory,size_t size,char **err)

{
  uchar **ppuVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ostream *poVar5;
  void *pvVar6;
  uchar *in_RCX;
  int *in_RDX;
  int *in_RSI;
  long *in_RDI;
  size_t in_R8;
  int i_4;
  uchar **src_1;
  int srcIdx_1;
  int idx_1;
  int jj_1;
  int ii_1;
  int i_3;
  int j_1;
  int it_1;
  float val;
  int i_2;
  uchar **src;
  int srcIdx;
  int idx;
  int jj;
  int ii;
  int i_1;
  int j;
  int it;
  int c;
  int idxA;
  int idxB;
  int idxG;
  int idxR;
  int i;
  stringstream ss;
  int ret;
  EXRHeader exr_header;
  EXRImage exr_image;
  EXRVersion exr_version;
  EXRHeader *in_stack_fffffffffffffaf8;
  string *in_stack_fffffffffffffb00;
  string *msg;
  EXRImage *in_stack_fffffffffffffb08;
  allocator *paVar7;
  int local_4cc;
  int local_4b0;
  int local_4ac;
  int local_4a8;
  allocator<char> local_4a1;
  string local_4a0 [24];
  char **in_stack_fffffffffffffb78;
  size_t in_stack_fffffffffffffb80;
  uchar *in_stack_fffffffffffffb88;
  EXRHeader *in_stack_fffffffffffffb90;
  EXRImage *in_stack_fffffffffffffb98;
  allocator local_451;
  string local_450 [32];
  undefined4 local_430;
  int local_42c;
  uchar **local_428;
  int local_41c;
  int local_418;
  int local_414;
  int local_410;
  int local_40c;
  int local_408;
  int local_404;
  int local_400;
  int local_3fc;
  int local_3f8;
  int local_3f4;
  int local_3f0;
  int local_3ec;
  string local_3e8 [32];
  stringstream local_3c8 [16];
  ostream local_3b8 [160];
  char **in_stack_fffffffffffffce8;
  size_t in_stack_fffffffffffffcf0;
  uchar *in_stack_fffffffffffffcf8;
  EXRVersion *in_stack_fffffffffffffd00;
  EXRHeader *in_stack_fffffffffffffd08;
  int local_200;
  int local_1fc;
  int local_1f8;
  long local_1d0;
  long local_1c8;
  int local_1c0;
  long local_1b8;
  EXRImage local_b0;
  EXRVersion local_80;
  allocator local_59;
  string local_58 [40];
  size_t local_30;
  uchar *local_28;
  int *local_20;
  int *local_18;
  long *local_10;
  int local_4;
  
  if ((in_RDI == (long *)0x0) || (in_RCX == (uchar *)0x0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_58,"Invalid argument for LoadEXRFromMemory",&local_59);
    tinyexr::SetErrorMessage(in_stack_fffffffffffffb00,(char **)in_stack_fffffffffffffaf8);
    std::__cxx11::string::~string(local_58);
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
    local_4 = -3;
  }
  else {
    local_30 = in_R8;
    local_28 = in_RCX;
    local_20 = in_RDX;
    local_18 = in_RSI;
    local_10 = in_RDI;
    InitEXRHeader((EXRHeader *)0x44cd15);
    iVar2 = ParseEXRVersionFromMemory(&local_80,local_28,local_30);
    if (iVar2 == 0) {
      local_4 = ParseEXRHeaderFromMemory
                          (in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,
                           in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0,
                           in_stack_fffffffffffffce8);
      if (local_4 == 0) {
        for (local_3ec = 0; local_3ec < local_1c0; local_3ec = local_3ec + 1) {
          if (*(int *)(local_1c8 + (long)local_3ec * 4) == 1) {
            *(undefined4 *)(local_1b8 + (long)local_3ec * 4) = 2;
          }
        }
        InitEXRImage(&local_b0);
        local_4 = LoadEXRImageFromMemory
                            (in_stack_fffffffffffffb98,in_stack_fffffffffffffb90,
                             in_stack_fffffffffffffb88,in_stack_fffffffffffffb80,
                             in_stack_fffffffffffffb78);
        if (local_4 == 0) {
          local_3f0 = -1;
          local_3f4 = -1;
          local_3f8 = -1;
          local_3fc = -1;
          for (local_400 = 0; local_400 < local_1c0; local_400 = local_400 + 1) {
            iVar2 = strcmp((char *)(local_1d0 + (long)local_400 * 0x110),"R");
            if (iVar2 == 0) {
              local_3f0 = local_400;
            }
            else {
              iVar2 = strcmp((char *)(local_1d0 + (long)local_400 * 0x110),"G");
              if (iVar2 == 0) {
                local_3f4 = local_400;
              }
              else {
                iVar2 = strcmp((char *)(local_1d0 + (long)local_400 * 0x110),"B");
                if (iVar2 == 0) {
                  local_3f8 = local_400;
                }
                else {
                  iVar2 = strcmp((char *)(local_1d0 + (long)local_400 * 0x110),"A");
                  if (iVar2 == 0) {
                    local_3fc = local_400;
                  }
                }
              }
            }
          }
          if (local_1c0 == 1) {
            pvVar6 = malloc((long)local_b0.width * 0x10 * (long)local_b0.height);
            *local_10 = (long)pvVar6;
            if (local_200 == 0) {
              for (local_42c = 0; local_42c < local_b0.width * local_b0.height;
                  local_42c = local_42c + 1) {
                local_430 = *(undefined4 *)(*local_b0.images + (long)local_42c * 4);
                *(undefined4 *)(*local_10 + (long)(local_42c << 2) * 4) = local_430;
                *(undefined4 *)(*local_10 + (long)(local_42c * 4 + 1) * 4) = local_430;
                *(undefined4 *)(*local_10 + (long)(local_42c * 4 + 2) * 4) = local_430;
                *(undefined4 *)(*local_10 + (long)(local_42c * 4 + 3) * 4) = local_430;
              }
            }
            else {
              for (local_404 = 0; local_404 < local_b0.num_tiles; local_404 = local_404 + 1) {
                for (local_408 = 0; local_408 < local_1f8; local_408 = local_408 + 1) {
                  for (local_40c = 0; local_40c < local_1fc; local_40c = local_40c + 1) {
                    local_410 = local_b0.tiles[local_404].offset_x * local_1fc + local_40c;
                    local_414 = local_b0.tiles[local_404].offset_y * local_1f8 + local_408;
                    local_418 = local_410 + local_414 * local_b0.width;
                    if ((local_410 < local_b0.width) && (local_414 < local_b0.height)) {
                      local_41c = local_40c + local_408 * local_1fc;
                      local_428 = local_b0.tiles[local_404].images;
                      *(undefined4 *)(*local_10 + (long)(local_418 * 4) * 4) =
                           *(undefined4 *)(*local_428 + (long)local_41c * 4);
                      *(undefined4 *)(*local_10 + (long)(local_418 * 4 + 1) * 4) =
                           *(undefined4 *)(*local_428 + (long)local_41c * 4);
                      *(undefined4 *)(*local_10 + (long)(local_418 * 4 + 2) * 4) =
                           *(undefined4 *)(*local_428 + (long)local_41c * 4);
                      *(undefined4 *)(*local_10 + (long)(local_418 * 4 + 3) * 4) =
                           *(undefined4 *)(*local_428 + (long)local_41c * 4);
                    }
                  }
                }
              }
            }
          }
          else {
            if (local_3f0 == -1) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_450,"R channel not found",&local_451);
              tinyexr::SetErrorMessage(in_stack_fffffffffffffb00,(char **)in_stack_fffffffffffffaf8)
              ;
              std::__cxx11::string::~string(local_450);
              std::allocator<char>::~allocator((allocator<char> *)&local_451);
              return -4;
            }
            if (local_3f4 == -1) {
              paVar7 = (allocator *)&stack0xfffffffffffffb87;
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        ((string *)&stack0xfffffffffffffb88,"G channel not found",paVar7);
              tinyexr::SetErrorMessage(in_stack_fffffffffffffb00,(char **)in_stack_fffffffffffffaf8)
              ;
              std::__cxx11::string::~string((string *)&stack0xfffffffffffffb88);
              std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffb87);
              return -4;
            }
            if (local_3f8 == -1) {
              msg = (string *)&local_4a1;
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_4a0,"B channel not found",(allocator *)msg);
              tinyexr::SetErrorMessage(msg,(char **)in_stack_fffffffffffffaf8);
              std::__cxx11::string::~string(local_4a0);
              std::allocator<char>::~allocator(&local_4a1);
              return -4;
            }
            pvVar6 = malloc((long)local_b0.width * 0x10 * (long)local_b0.height);
            *local_10 = (long)pvVar6;
            if (local_200 == 0) {
              for (local_4cc = 0; local_4cc < local_b0.width * local_b0.height;
                  local_4cc = local_4cc + 1) {
                *(undefined4 *)(*local_10 + (long)(local_4cc << 2) * 4) =
                     *(undefined4 *)(local_b0.images[local_3f0] + (long)local_4cc * 4);
                *(undefined4 *)(*local_10 + (long)(local_4cc * 4 + 1) * 4) =
                     *(undefined4 *)(local_b0.images[local_3f4] + (long)local_4cc * 4);
                *(undefined4 *)(*local_10 + (long)(local_4cc * 4 + 2) * 4) =
                     *(undefined4 *)(local_b0.images[local_3f8] + (long)local_4cc * 4);
                if (local_3fc == -1) {
                  *(undefined4 *)(*local_10 + (long)(local_4cc * 4 + 3) * 4) = 0x3f800000;
                }
                else {
                  *(undefined4 *)(*local_10 + (long)(local_4cc * 4 + 3) * 4) =
                       *(undefined4 *)(local_b0.images[local_3fc] + (long)local_4cc * 4);
                }
              }
            }
            else {
              for (local_4a8 = 0; local_4a8 < local_b0.num_tiles; local_4a8 = local_4a8 + 1) {
                for (local_4ac = 0; local_4ac < local_1f8; local_4ac = local_4ac + 1) {
                  for (local_4b0 = 0; local_4b0 < local_1fc; local_4b0 = local_4b0 + 1) {
                    iVar2 = local_b0.tiles[local_4a8].offset_x * local_1fc + local_4b0;
                    iVar3 = local_b0.tiles[local_4a8].offset_y * local_1f8 + local_4ac;
                    iVar4 = iVar2 + iVar3 * local_b0.width;
                    if ((iVar2 < local_b0.width) && (iVar3 < local_b0.height)) {
                      iVar2 = local_4b0 + local_4ac * local_1fc;
                      ppuVar1 = local_b0.tiles[local_4a8].images;
                      *(undefined4 *)(*local_10 + (long)(iVar4 * 4) * 4) =
                           *(undefined4 *)(ppuVar1[local_3f0] + (long)iVar2 * 4);
                      *(undefined4 *)(*local_10 + (long)(iVar4 * 4 + 1) * 4) =
                           *(undefined4 *)(ppuVar1[local_3f4] + (long)iVar2 * 4);
                      *(undefined4 *)(*local_10 + (long)(iVar4 * 4 + 2) * 4) =
                           *(undefined4 *)(ppuVar1[local_3f8] + (long)iVar2 * 4);
                      if (local_3fc == -1) {
                        *(undefined4 *)(*local_10 + (long)(iVar4 * 4 + 3) * 4) = 0x3f800000;
                      }
                      else {
                        *(undefined4 *)(*local_10 + (long)(iVar4 * 4 + 3) * 4) =
                             *(undefined4 *)(ppuVar1[local_3fc] + (long)iVar2 * 4);
                      }
                    }
                  }
                }
              }
            }
          }
          *local_18 = local_b0.width;
          *local_20 = local_b0.height;
          FreeEXRHeader(in_stack_fffffffffffffaf8);
          FreeEXRImage(in_stack_fffffffffffffb08);
          local_4 = 0;
        }
      }
    }
    else {
      std::__cxx11::stringstream::stringstream(local_3c8);
      poVar5 = std::operator<<(local_3b8,"Failed to parse EXR version. code(");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar2);
      std::operator<<(poVar5,")");
      std::__cxx11::stringstream::str();
      tinyexr::SetErrorMessage(in_stack_fffffffffffffb00,(char **)in_stack_fffffffffffffaf8);
      std::__cxx11::string::~string(local_3e8);
      local_4 = iVar2;
      std::__cxx11::stringstream::~stringstream(local_3c8);
    }
  }
  return local_4;
}

Assistant:

int LoadEXRFromMemory(float **out_rgba, int *width, int *height,
                      const unsigned char *memory, size_t size,
                      const char **err) {
  if (out_rgba == NULL || memory == NULL) {
    tinyexr::SetErrorMessage("Invalid argument for LoadEXRFromMemory", err);
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

  EXRVersion exr_version;
  EXRImage exr_image;
  EXRHeader exr_header;

  InitEXRHeader(&exr_header);

  int ret = ParseEXRVersionFromMemory(&exr_version, memory, size);
  if (ret != TINYEXR_SUCCESS) {
    std::stringstream ss;
    ss << "Failed to parse EXR version. code(" << ret << ")";
    tinyexr::SetErrorMessage(ss.str(), err);
    return ret;
  }

  ret = ParseEXRHeaderFromMemory(&exr_header, &exr_version, memory, size, err);
  if (ret != TINYEXR_SUCCESS) {
    return ret;
  }

  // Read HALF channel as FLOAT.
  for (int i = 0; i < exr_header.num_channels; i++) {
    if (exr_header.pixel_types[i] == TINYEXR_PIXELTYPE_HALF) {
      exr_header.requested_pixel_types[i] = TINYEXR_PIXELTYPE_FLOAT;
    }
  }

  InitEXRImage(&exr_image);
  ret = LoadEXRImageFromMemory(&exr_image, &exr_header, memory, size, err);
  if (ret != TINYEXR_SUCCESS) {
    return ret;
  }

  // RGBA
  int idxR = -1;
  int idxG = -1;
  int idxB = -1;
  int idxA = -1;
  for (int c = 0; c < exr_header.num_channels; c++) {
    if (strcmp(exr_header.channels[c].name, "R") == 0) {
      idxR = c;
    } else if (strcmp(exr_header.channels[c].name, "G") == 0) {
      idxG = c;
    } else if (strcmp(exr_header.channels[c].name, "B") == 0) {
      idxB = c;
    } else if (strcmp(exr_header.channels[c].name, "A") == 0) {
      idxA = c;
    }
  }

  // TODO(syoyo): Refactor removing same code as used in LoadEXR().
  if (exr_header.num_channels == 1) {
    // Grayscale channel only.

    (*out_rgba) = reinterpret_cast<float *>(
        malloc(4 * sizeof(float) * static_cast<size_t>(exr_image.width) *
               static_cast<size_t>(exr_image.height)));

    if (exr_header.tiled) {
      for (int it = 0; it < exr_image.num_tiles; it++) {
        for (int j = 0; j < exr_header.tile_size_y; j++) {
          for (int i = 0; i < exr_header.tile_size_x; i++) {
            const int ii =
                exr_image.tiles[it].offset_x * exr_header.tile_size_x + i;
            const int jj =
                exr_image.tiles[it].offset_y * exr_header.tile_size_y + j;
            const int idx = ii + jj * exr_image.width;

            // out of region check.
            if (ii >= exr_image.width) {
              continue;
            }
            if (jj >= exr_image.height) {
              continue;
            }
            const int srcIdx = i + j * exr_header.tile_size_x;
            unsigned char **src = exr_image.tiles[it].images;
            (*out_rgba)[4 * idx + 0] =
                reinterpret_cast<float **>(src)[0][srcIdx];
            (*out_rgba)[4 * idx + 1] =
                reinterpret_cast<float **>(src)[0][srcIdx];
            (*out_rgba)[4 * idx + 2] =
                reinterpret_cast<float **>(src)[0][srcIdx];
            (*out_rgba)[4 * idx + 3] =
                reinterpret_cast<float **>(src)[0][srcIdx];
          }
        }
      }
    } else {
      for (int i = 0; i < exr_image.width * exr_image.height; i++) {
        const float val = reinterpret_cast<float **>(exr_image.images)[0][i];
        (*out_rgba)[4 * i + 0] = val;
        (*out_rgba)[4 * i + 1] = val;
        (*out_rgba)[4 * i + 2] = val;
        (*out_rgba)[4 * i + 3] = val;
      }
    }

  } else {
    // TODO(syoyo): Support non RGBA image.

    if (idxR == -1) {
      tinyexr::SetErrorMessage("R channel not found", err);

      // @todo { free exr_image }
      return TINYEXR_ERROR_INVALID_DATA;
    }

    if (idxG == -1) {
      tinyexr::SetErrorMessage("G channel not found", err);
      // @todo { free exr_image }
      return TINYEXR_ERROR_INVALID_DATA;
    }

    if (idxB == -1) {
      tinyexr::SetErrorMessage("B channel not found", err);
      // @todo { free exr_image }
      return TINYEXR_ERROR_INVALID_DATA;
    }

    (*out_rgba) = reinterpret_cast<float *>(
        malloc(4 * sizeof(float) * static_cast<size_t>(exr_image.width) *
               static_cast<size_t>(exr_image.height)));

    if (exr_header.tiled) {
      for (int it = 0; it < exr_image.num_tiles; it++) {
        for (int j = 0; j < exr_header.tile_size_y; j++)
          for (int i = 0; i < exr_header.tile_size_x; i++) {
            const int ii =
                exr_image.tiles[it].offset_x * exr_header.tile_size_x + i;
            const int jj =
                exr_image.tiles[it].offset_y * exr_header.tile_size_y + j;
            const int idx = ii + jj * exr_image.width;

            // out of region check.
            if (ii >= exr_image.width) {
              continue;
            }
            if (jj >= exr_image.height) {
              continue;
            }
            const int srcIdx = i + j * exr_header.tile_size_x;
            unsigned char **src = exr_image.tiles[it].images;
            (*out_rgba)[4 * idx + 0] =
                reinterpret_cast<float **>(src)[idxR][srcIdx];
            (*out_rgba)[4 * idx + 1] =
                reinterpret_cast<float **>(src)[idxG][srcIdx];
            (*out_rgba)[4 * idx + 2] =
                reinterpret_cast<float **>(src)[idxB][srcIdx];
            if (idxA != -1) {
              (*out_rgba)[4 * idx + 3] =
                  reinterpret_cast<float **>(src)[idxA][srcIdx];
            } else {
              (*out_rgba)[4 * idx + 3] = 1.0;
            }
          }
      }
    } else {
      for (int i = 0; i < exr_image.width * exr_image.height; i++) {
        (*out_rgba)[4 * i + 0] =
            reinterpret_cast<float **>(exr_image.images)[idxR][i];
        (*out_rgba)[4 * i + 1] =
            reinterpret_cast<float **>(exr_image.images)[idxG][i];
        (*out_rgba)[4 * i + 2] =
            reinterpret_cast<float **>(exr_image.images)[idxB][i];
        if (idxA != -1) {
          (*out_rgba)[4 * i + 3] =
              reinterpret_cast<float **>(exr_image.images)[idxA][i];
        } else {
          (*out_rgba)[4 * i + 3] = 1.0;
        }
      }
    }
  }

  (*width) = exr_image.width;
  (*height) = exr_image.height;

  FreeEXRHeader(&exr_header);
  FreeEXRImage(&exr_image);

  return TINYEXR_SUCCESS;
}